

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_number_decimal(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_decimal128_t decimal128;
  bson_iter_t iter;
  bson_t b;
  bson_error_t error;
  long local_410;
  long local_408;
  undefined1 local_400 [128];
  undefined1 local_380 [232];
  undefined1 local_298 [8];
  undefined1 local_290 [640];
  
  cVar1 = bson_init_from_json(local_380,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,local_298);
  if (cVar1 == '\0') {
    fprintf(_stderr,"%s\n",local_290);
    pcVar4 = "r";
    uVar3 = 0x906;
  }
  else {
    cVar1 = bson_iter_init(local_400,local_380);
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init (&iter, &b)";
      uVar3 = 0x907;
    }
    else {
      cVar1 = bson_iter_find(local_400,"key");
      if (cVar1 == '\0') {
        pcVar4 = "bson_iter_find (&iter, \"key\")";
        uVar3 = 0x908;
      }
      else {
        iVar2 = bson_iter_type(local_400);
        if (iVar2 == 0x13) {
          bson_iter_decimal128(local_400,&local_410);
          if (local_410 == 0xb) {
            if (local_408 == 0x3040000000000000) {
              bson_destroy(local_380);
              return;
            }
            pcVar4 = "decimal128.high == 0x3040000000000000ULL";
            uVar3 = 0x90c;
          }
          else {
            pcVar4 = "decimal128.low == 11";
            uVar3 = 0x90b;
          }
        }
        else {
          pcVar4 = "BSON_ITER_HOLDS_DECIMAL128 (&iter)";
          uVar3 = 0x909;
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_json_number_decimal",pcVar4);
  abort();
}

Assistant:

static void
test_bson_json_number_decimal (void)
{
   bson_error_t error;
   bson_iter_t iter;
   bson_decimal128_t decimal128;
   const char *json = "{ \"key\" : { \"$numberDecimal\": \"11\" }}";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find (&iter, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   bson_iter_decimal128 (&iter, &decimal128);
   BSON_ASSERT (decimal128.low == 11);
   BSON_ASSERT (decimal128.high == 0x3040000000000000ULL);
   bson_destroy (&b);
}